

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeTestAndBranch(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  DecodeStatus extraout_EAX;
  uint *puVar2;
  ulong Val;
  
  puVar2 = GPR64DecoderTable;
  if (-1 < (int)insn) {
    puVar2 = GPR32DecoderTable;
  }
  MCOperand_CreateReg0(Inst,puVar2[insn & 0x1f]);
  uVar1 = insn >> 5 & 0x3fff;
  Val = (ulong)uVar1 - 0x4000;
  if (uVar1 < 0x2000) {
    Val = (ulong)uVar1;
  }
  MCOperand_CreateImm0(Inst,(ulong)(insn >> 0x1a & 0xffffffe0 | insn >> 0x13 & 0x1f));
  MCOperand_CreateImm0(Inst,Val);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeTestAndBranch(MCInst *Inst, uint32_t insn,
		uint64_t Addr, const void *Decoder)
{
	uint32_t Rt = fieldFromInstruction(insn, 0, 5);
	uint32_t bit = fieldFromInstruction(insn, 31, 1) << 5;
	uint64_t dst = fieldFromInstruction(insn, 5, 14);

	bit |= fieldFromInstruction(insn, 19, 5);

	// Sign-extend 14-bit immediate.
	if (dst & (1 << (14 - 1)))
		dst |= ~((1LL << 14) - 1);

	if (fieldFromInstruction(insn, 31, 1) == 0)
		DecodeGPR32RegisterClass(Inst, Rt, Addr, Decoder);
	else
		DecodeGPR64RegisterClass(Inst, Rt, Addr, Decoder);

	MCOperand_CreateImm0(Inst, bit);
	//if (!Dis->tryAddingSymbolicOperand(Inst, dst << 2, Addr, true, 0, 4))
	MCOperand_CreateImm0(Inst, dst);

	return Success;
}